

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O0

int blake2sp_update(blake2sp_state *S,void *pin,size_t inlen)

{
  ulong uVar1;
  void *local_50;
  uchar *in__;
  size_t inlen__;
  size_t i;
  size_t fill;
  size_t left;
  uchar *in;
  size_t inlen_local;
  void *pin_local;
  blake2sp_state *S_local;
  
  fill = S->buflen;
  uVar1 = 0x200 - fill;
  left = (size_t)pin;
  in = (uchar *)inlen;
  if ((fill != 0) && (uVar1 <= inlen)) {
    memcpy(S->buf + fill,pin,uVar1);
    for (inlen__ = 0; inlen__ < 8; inlen__ = inlen__ + 1) {
      blake2s_update(S->S[inlen__],S->buf + inlen__ * 0x40,0x40);
    }
    left = uVar1 + (long)pin;
    in = (uchar *)(inlen - uVar1);
    fill = 0;
  }
  for (inlen__ = 0; inlen__ < 8; inlen__ = inlen__ + 1) {
    local_50 = (void *)(inlen__ * 0x40 + left);
    for (in__ = in; (uchar *)0x1ff < in__; in__ = in__ + -0x200) {
      blake2s_update(S->S[inlen__],local_50,0x40);
      local_50 = (void *)((long)local_50 + 0x200);
    }
  }
  uVar1 = (ulong)in & 0x1ff;
  if (uVar1 != 0) {
    memcpy(S->buf + fill,in + (left - ((ulong)in & 0x1ff)),uVar1);
  }
  S->buflen = fill + uVar1;
  return 0;
}

Assistant:

int blake2sp_update( blake2sp_state *S, const void *pin, size_t inlen )
{
  const unsigned char * in = (const unsigned char *)pin;
  size_t left = S->buflen;
  size_t fill = sizeof( S->buf ) - left;
  size_t i;

  if( left && inlen >= fill )
  {
    memcpy( S->buf + left, in, fill );

    for( i = 0; i < PARALLELISM_DEGREE; ++i )
      blake2s_update( S->S[i], S->buf + i * BLAKE2S_BLOCKBYTES, BLAKE2S_BLOCKBYTES );

    in += fill;
    inlen -= fill;
    left = 0;
  }

#if defined(_OPENMP)
  #pragma omp parallel shared(S), num_threads(PARALLELISM_DEGREE)
#else
  for( i = 0; i < PARALLELISM_DEGREE; ++i )
#endif
  {
#if defined(_OPENMP)
    size_t      i = omp_get_thread_num();
#endif
    size_t inlen__ = inlen;
    const unsigned char *in__ = ( const unsigned char * )in;
    in__ += i * BLAKE2S_BLOCKBYTES;

    while( inlen__ >= PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES )
    {
      blake2s_update( S->S[i], in__, BLAKE2S_BLOCKBYTES );
      in__ += PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES;
      inlen__ -= PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES;
    }
  }

  in += inlen - inlen % ( PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES );
  inlen %= PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES;

  if( inlen > 0 )
    memcpy( S->buf + left, in, inlen );

  S->buflen = left + inlen;
  return 0;
}